

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::acceptorT11FixturenextResendRequestT1150RepeatingGroupHelper::RunImpl
          (acceptorT11FixturenextResendRequestT1150RepeatingGroupHelper *this)

{
  undefined1 *this_00;
  FieldMap *this_01;
  Message *pMVar1;
  TestResults *pTVar2;
  char cVar3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  OrigSendingTime origSendingTime;
  SendingTime sendingTime;
  PossDupFlag possDupFlag;
  Message message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  undefined1 local_3a8 [16];
  _Alloc_hider _Stack_398;
  undefined1 local_348 [16];
  _Alloc_hider _Stack_338;
  TestDetails local_2e8;
  undefined1 local_2c8 [16];
  _Alloc_hider _Stack_2b8;
  undefined1 local_170 [344];
  
  pMVar1 = (Message *)(this->super_acceptorT11Fixture).super_sessionT11Fixture.object;
  createT11Logon((Logon *)local_170,"ISLD","TW",1);
  FIX::DateTime::nowUtc();
  local_3a8._8_8_ = local_2c8._8_8_;
  _Stack_398._M_p = _Stack_2b8._M_p;
  local_3a8._0_8_ = &PTR__DateTime_00324850;
  FIX::Session::next(pMVar1,(UtcTimeStamp *)local_170,SUB81(local_3a8,0));
  FIX::Message::~Message((Message *)local_170);
  createT1150ExecutionReport((ExecutionReport *)local_2c8,"ISLD","TW",2);
  FIX::Message::Message((Message *)local_170,(Message *)local_2c8);
  FIX::Message::~Message((Message *)local_2c8);
  cVar3 = FIX::Session::send((Message *)
                             (this->super_acceptorT11Fixture).super_sessionT11Fixture.object);
  if (cVar3 == '\0') {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar2 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails((TestDetails *)local_2c8,*ppTVar5,0x502);
    UnitTest::TestResults::OnTestFailure(pTVar2,(TestDetails *)local_2c8,"object->send( message )");
  }
  pMVar1 = (Message *)(this->super_acceptorT11Fixture).super_sessionT11Fixture.object;
  createT11ResendRequest((ResendRequest *)local_2c8,"ISLD","TW",3,2,2);
  FIX::DateTime::nowUtc();
  local_348._8_8_ = local_3a8._8_8_;
  _Stack_338._M_p = _Stack_398._M_p;
  local_348._0_8_ = &PTR__DateTime_00324850;
  FIX::Session::next(pMVar1,(UtcTimeStamp *)local_2c8,SUB81(local_348,0));
  FIX::Message::~Message((Message *)local_2c8);
  FIX::BoolField::BoolField((BoolField *)local_2c8,0x2b);
  local_2c8._0_8_ = &PTR__FieldBase_00326c78;
  FIX::UtcTimeStampField::UtcTimeStampField((UtcTimeStampField *)local_3a8,0x7a,0);
  local_3a8._0_8_ = &PTR__FieldBase_00326cb0;
  FIX::UtcTimeStampField::UtcTimeStampField((UtcTimeStampField *)local_348,0x34,0);
  local_348._0_8_ = &PTR__FieldBase_00325d28;
  this_00 = &(this->super_acceptorT11Fixture).super_sessionT11Fixture.super_TestCallback.field_0xe0;
  FIX::FieldMap::getField((FieldMap *)this_00,(FieldBase *)local_2c8);
  FIX::FieldMap::getField((FieldMap *)this_00,(FieldBase *)local_3a8);
  FIX::FieldMap::getField((FieldMap *)this_00,(FieldBase *)local_348);
  this_01 = (FieldMap *)(local_170 + 0x70);
  FIX::FieldMap::setField(this_01,(FieldBase *)local_2c8,true);
  FIX::FieldMap::setField(this_01,(FieldBase *)local_3a8,true);
  FIX::FieldMap::setField(this_01,(FieldBase *)local_348,true);
  ppTVar4 = UnitTest::CurrentTest::Results();
  pTVar2 = *ppTVar4;
  FIX::Message::toString_abi_cxx11_((int)&local_3e8,(int)local_170,8);
  FIX::Message::toString_abi_cxx11_((int)&local_3c8,(int)this + 0x70,8);
  ppTVar5 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_2e8,*ppTVar5,0x50e);
  UnitTest::CheckEqual<std::__cxx11::string,std::__cxx11::string>
            (pTVar2,&local_3e8,&local_3c8,&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_348);
  FIX::FieldBase::~FieldBase((FieldBase *)local_3a8);
  FIX::FieldBase::~FieldBase((FieldBase *)local_2c8);
  FIX::Message::~Message((Message *)local_170);
  return;
}

Assistant:

TEST_FIXTURE(acceptorT11Fixture, nextResendRequestT1150RepeatingGroup)
{
  object->next( createT11Logon( "ISLD", "TW", 1 ), UtcTimeStamp() );
  FIX::Message message = createT1150ExecutionReport( "ISLD", "TW", 2 );
  CHECK( object->send( message ) );
  object->next( createT11ResendRequest( "ISLD", "TW", 3, 2, 2 ), UtcTimeStamp() );

  PossDupFlag possDupFlag;
  OrigSendingTime origSendingTime;
  SendingTime sendingTime;
  lastResent.getHeader().getField( possDupFlag );
  lastResent.getHeader().getField( origSendingTime );
  lastResent.getHeader().getField( sendingTime );
  message.getHeader().setField( possDupFlag );
  message.getHeader().setField( origSendingTime );
  message.getHeader().setField( sendingTime );
  CHECK_EQUAL( message.toString(), lastResent.toString() );
}